

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

void __thiscall gl3cts::ReservedNamesTest::deinit(ReservedNamesTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  uint local_1c;
  GLuint current_so_id;
  uint n_so_id;
  Functions *gl;
  ReservedNamesTest *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
    if (this->m_so_ids[local_1c] != 0) {
      (**(code **)(CONCAT44(extraout_var,iVar1) + 0x470))(this->m_so_ids[local_1c]);
    }
  }
  return;
}

Assistant:

void ReservedNamesTest::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (unsigned int n_so_id = 0; n_so_id < sizeof(m_so_ids) / sizeof(m_so_ids[0]); ++n_so_id)
	{
		const glw::GLuint current_so_id = m_so_ids[n_so_id];

		if (current_so_id != 0)
		{
			gl.deleteShader(current_so_id);
		}
	} /* for (all usedshader object IDs) */
}